

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.h
# Opt level: O2

ssize_t __thiscall
lossless_neural_sound::audio::File_input_stream::read
          (File_input_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 uVar1;
  int iVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  void *pvVar4;
  
  pvVar4 = (void *)0x0;
  while ((pvVar3 = __buf, __buf != pvVar4 &&
         (iVar2 = std::istream::peek(), pvVar3 = pvVar4, iVar2 != -1))) {
    uVar1 = std::istream::get();
    *(undefined1 *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar4) = uVar1;
    pvVar4 = (void *)((long)pvVar4 + 1);
  }
  return (ssize_t)pvVar3;
}

Assistant:

virtual std::size_t read(unsigned char *buffer, std::size_t buffer_size) override
    {
        std::size_t retval = 0;
        while(buffer_size > 0 && is.peek() != std::char_traits<char>::eof())
        {
            *buffer++ = is.get();
            buffer_size--;
            retval++;
        }
        return retval;
    }